

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

void __thiscall ctemplate::TemplateCache::TemplateCache(TemplateCache *this)

{
  TemplateMap *pTVar1;
  TemplateCallMap *pTVar2;
  Mutex *pMVar3;
  
  pTVar1 = (TemplateMap *)operator_new(0x38);
  (pTVar1->_M_h)._M_buckets = &(pTVar1->_M_h)._M_single_bucket;
  (pTVar1->_M_h)._M_bucket_count = 1;
  (pTVar1->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pTVar1->_M_h)._M_element_count = 0;
  (pTVar1->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (pTVar1->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pTVar1->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this->parsed_template_cache_ = pTVar1;
  this->is_frozen_ = false;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->search_path_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (TemplateCallMap *)operator_new(0x38);
  (pTVar2->_M_h)._M_buckets = &(pTVar2->_M_h)._M_single_bucket;
  (pTVar2->_M_h)._M_bucket_count = 1;
  (pTVar2->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pTVar2->_M_h)._M_element_count = 0;
  (pTVar2->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (pTVar2->_M_h)._M_rehash_policy._M_next_resize = 0;
  (pTVar2->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  this->get_template_calls_ = pTVar2;
  pMVar3 = (Mutex *)operator_new(8);
  pMVar3->mutex_ = 0;
  this->mutex_ = pMVar3;
  pMVar3 = (Mutex *)operator_new(8);
  pMVar3->mutex_ = 0;
  this->search_path_mutex_ = pMVar3;
  return;
}

Assistant:

TemplateCache::TemplateCache()
    : parsed_template_cache_(new TemplateMap),
      is_frozen_(false),
      search_path_(),
      get_template_calls_(new TemplateCallMap),
      mutex_(new Mutex),
      search_path_mutex_(new Mutex) {
}